

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAParameters.cpp
# Opt level: O3

bool __thiscall RSAParameters::deserialise(RSAParameters *this,ByteString *serialised)

{
  size_t sVar1;
  unsigned_long uVar2;
  bool bVar3;
  ByteString dLen;
  ByteString dE;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::chainDeserialise(&local_38,serialised);
  ByteString::chainDeserialise(&local_60,serialised);
  sVar1 = ByteString::size(&local_38);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_60);
    if (sVar1 != 0) {
      ByteString::operator=(&this->e,&local_38);
      uVar2 = ByteString::long_val(&local_60);
      this->bitLen = uVar2;
      bVar3 = true;
      goto LAB_00130232;
    }
  }
  bVar3 = false;
LAB_00130232:
  local_60._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_60.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar3;
}

Assistant:

bool RSAParameters::deserialise(ByteString& serialised)
{
	ByteString dE = ByteString::chainDeserialise(serialised);
	ByteString dLen = ByteString::chainDeserialise(serialised);

	if ((dE.size() == 0) ||
	    (dLen.size() == 0))
        {
		return false;
	}

	setE(dE);
	setBitLength(dLen.long_val());

        return true;
}